

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::anon_unknown_0::Stack::getSelfBinding(Stack *this,HeapObject **self,uint *offset)

{
  pointer pFVar1;
  ulong uVar2;
  uint uVar3;
  
  *self = (HeapObject *)0x0;
  *offset = 0;
  pFVar1 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->stack).
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 400 & 0xffffffff;
  do {
    uVar2 = uVar2 - 1;
    if ((int)(uint)uVar2 < 0) {
      return;
    }
    uVar3 = (uint)uVar2 & 0x7fffffff;
  } while (pFVar1[uVar3].kind != FRAME_CALL);
  *self = pFVar1[uVar3].self;
  *offset = (this->stack).
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar3].offset;
  return;
}

Assistant:

void getSelfBinding(HeapObject *&self, unsigned &offset)
    {
        self = nullptr;
        offset = 0;
        for (int i = stack.size() - 1; i >= 0; --i) {
            if (stack[i].isCall()) {
                self = stack[i].self;
                offset = stack[i].offset;
                return;
            }
        }
    }